

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFBoundingBox.cpp
# Opt level: O1

void __thiscall ZXing::Pdf417::BoundingBox::calculateMinMaxValues(BoundingBox *this)

{
  double dVar1;
  double dVar2;
  Nullable<ZXing::ResultPoint> *pNVar3;
  Nullable<ZXing::ResultPoint> *pNVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  if ((this->_topLeft).m_hasValue == false) {
    pNVar4 = &this->_topLeft;
    pNVar3 = &this->_topRight;
    lVar5 = 0x30;
    lVar6 = 0x28;
    lVar7 = 0x20;
    lVar8 = 0x60;
    lVar9 = 0x18;
    dVar2 = 0.0;
    lVar10 = 0x10;
  }
  else {
    if ((this->_topRight).m_hasValue != false) goto LAB_0016ee7b;
    pNVar4 = &this->_topRight;
    pNVar3 = &this->_topLeft;
    dVar2 = (double)(this->_imgWidth + -1);
    lVar5 = 0x60;
    lVar6 = 0x58;
    lVar7 = 0x50;
    lVar8 = 0x30;
    lVar9 = 0x48;
    lVar10 = 0x40;
  }
  dVar1 = (pNVar3->m_value).super_PointF.y;
  pNVar4->m_hasValue = true;
  *(double *)((long)&this->_imgWidth + lVar10) = dVar2;
  *(double *)((long)&this->_imgWidth + lVar9) = (double)(float)dVar1;
  dVar1 = *(double *)((long)&this->_imgWidth + lVar8);
  *(undefined1 *)((long)&this->_imgWidth + lVar7) = 1;
  *(double *)((long)&this->_imgWidth + lVar6) = dVar2;
  *(double *)((long)&this->_imgWidth + lVar5) = (double)(float)dVar1;
LAB_0016ee7b:
  fVar17 = (float)(this->_topRight).m_value.super_PointF.y;
  fVar19 = (float)(this->_bottomLeft).m_value.super_PointF.y;
  fVar15 = (float)(this->_bottomLeft).m_value.super_PointF.x;
  fVar16 = (float)(this->_topRight).m_value.super_PointF.x;
  fVar21 = (float)(this->_topLeft).m_value.super_PointF.y;
  fVar22 = (float)(this->_bottomRight).m_value.super_PointF.y;
  fVar18 = (float)(this->_topLeft).m_value.super_PointF.x;
  fVar20 = (float)(this->_bottomRight).m_value.super_PointF.x;
  uVar11 = -(uint)(fVar15 < fVar18);
  uVar12 = -(uint)(fVar16 < fVar20);
  uVar13 = -(uint)(fVar17 < fVar21);
  uVar14 = -(uint)(fVar19 < fVar22);
  this->_minX = (int)(float)(~uVar11 & (uint)fVar18 | (uint)fVar15 & uVar11);
  this->_maxX = (int)(float)(~uVar12 & (uint)fVar16 | (uint)fVar20 & uVar12);
  this->_minY = (int)(float)(~uVar13 & (uint)fVar21 | (uint)fVar17 & uVar13);
  this->_maxY = (int)(float)(~uVar14 & (uint)fVar19 | (uint)fVar22 & uVar14);
  return;
}

Assistant:

void
BoundingBox::calculateMinMaxValues()
{
	if (_topLeft == nullptr) {
		_topLeft = ResultPoint(0.f, _topRight.value().y());
		_bottomLeft = ResultPoint(0.f, _bottomRight.value().y());
	}
	else if (_topRight == nullptr) {
		_topRight = ResultPoint(static_cast<float>(_imgWidth - 1), _topLeft.value().y());
		_bottomRight = ResultPoint(static_cast<float>(_imgWidth - 1), _bottomLeft.value().y());
	}

	_minX = static_cast<int>(std::min(_topLeft.value().x(), _bottomLeft.value().x()));
	_maxX = static_cast<int>(std::max(_topRight.value().x(), _bottomRight.value().x()));
	_minY = static_cast<int>(std::min(_topLeft.value().y(), _topRight.value().y()));
	_maxY = static_cast<int>(std::max(_bottomLeft.value().y(), _bottomRight.value().y()));
}